

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_residual_test.c
# Opt level: O1

void __thiscall lu_residual_test(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  void *__s;
  long lVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  iVar1 = *(int *)((long)this + 0x54);
  lVar14 = (long)iVar1;
  uVar2 = *(uint *)((long)this + 0x13c);
  lVar13 = *(long *)((long)this + 0x250);
  lVar19 = *(long *)((long)this + 0x1d8);
  lVar5 = *(long *)((long)this + 0x1e8);
  lVar18 = *(long *)((long)this + 0x278);
  lVar17 = *(long *)((long)this + 0x280);
  lVar6 = *(long *)((long)this + 0x2b0);
  lVar7 = *(long *)((long)this + 0x1a0);
  lVar8 = *(long *)((long)this + 0x1b8);
  lVar9 = *(long *)((long)this + 0x1a8);
  lVar10 = *(long *)((long)this + 0x1c0);
  __s = *(void **)((long)this + 0x298);
  lVar11 = *(long *)((long)this + 0x2a0);
  if (0 < lVar14) {
    lVar21 = *(long *)((long)this + 0x240);
    lVar15 = 0;
    do {
      lVar20 = (long)*(int *)(lVar21 + lVar15 * 4);
      uVar22 = *(uint *)(lVar7 + lVar20 * 4);
      dVar23 = 0.0;
      if (-1 < (int)uVar22) {
        lVar20 = lVar20 << 2;
        do {
          dVar23 = dVar23 + *(double *)(lVar11 + (ulong)uVar22 * 8) *
                            *(double *)(lVar8 + lVar20 * 2);
          uVar22 = *(uint *)(lVar7 + 4 + lVar20);
          lVar20 = lVar20 + 4;
        } while (-1 < (int)uVar22);
      }
      lVar20 = (long)*(int *)(lVar13 + lVar15 * 4);
      dVar25 = *(double *)(&DAT_003c50a0 + (ulong)(dVar23 <= 0.0) * 8);
      *(double *)((long)__s + lVar20 * 8) = dVar25;
      *(double *)(lVar11 + lVar20 * 8) = dVar25 - dVar23;
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar14);
  }
  uVar16 = (ulong)(iVar1 - 1);
  if (0 < iVar1) {
    do {
      lVar21 = (long)*(int *)(lVar5 + uVar16 * 4);
      dVar23 = *(double *)(lVar11 + lVar21 * 8) / *(double *)(lVar6 + lVar21 * 8);
      *(double *)(lVar11 + lVar21 * 8) = dVar23;
      lVar21 = (long)*(int *)(lVar17 + lVar21 * 4);
      uVar22 = *(uint *)(lVar9 + lVar21 * 4);
      if (-1 < (int)uVar22) {
        lVar21 = lVar21 << 2;
        do {
          *(double *)(lVar11 + (ulong)uVar22 * 8) =
               *(double *)(lVar10 + lVar21 * 2) * -dVar23 + *(double *)(lVar11 + (ulong)uVar22 * 8);
          uVar22 = *(uint *)(lVar9 + 4 + lVar21);
          lVar21 = lVar21 + 4;
        } while (-1 < (int)uVar22);
      }
      bVar12 = 0 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar12);
  }
  if (0 < (int)uVar2) {
    uVar16 = 0;
    do {
      iVar3 = *(int *)(lVar19 + uVar16 * 4);
      lVar21 = (long)Bbegin[iVar3];
      iVar4 = Bend[iVar3];
      if (Bbegin[iVar3] < iVar4) {
        dVar23 = *(double *)(lVar11 + (long)*(int *)(lVar5 + uVar16 * 4) * 8);
        do {
          *(double *)((long)__s + (long)Bi[lVar21] * 8) =
               Bx[lVar21] * -dVar23 + *(double *)((long)__s + (long)Bi[lVar21] * 8);
          lVar21 = lVar21 + 1;
        } while (iVar4 != lVar21);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar2);
  }
  lVar21 = (long)(int)uVar2;
  if ((int)uVar2 < iVar1) {
    do {
      lVar15 = (long)*(int *)(lVar5 + lVar21 * 4);
      *(double *)((long)__s + lVar15 * 8) =
           *(double *)((long)__s + lVar15 * 8) - *(double *)(lVar11 + lVar15 * 8);
      lVar21 = lVar21 + 1;
    } while (lVar14 != lVar21);
  }
  dVar23 = 0.0;
  dVar25 = 0.0;
  if (0 < iVar1) {
    lVar21 = 0;
    do {
      dVar25 = dVar25 + ABS(*(double *)(lVar11 + lVar21 * 8));
      lVar21 = lVar21 + 1;
    } while (lVar14 != lVar21);
  }
  if (0 < iVar1) {
    dVar23 = 0.0;
    lVar21 = 0;
    do {
      dVar23 = dVar23 + ABS(*(double *)((long)__s + lVar21 * 8));
      lVar21 = lVar21 + 1;
    } while (lVar14 != lVar21);
  }
  if (0 < iVar1) {
    lVar21 = 0;
    do {
      lVar15 = (long)*(int *)(lVar5 + lVar21 * 4);
      lVar20 = (long)*(int *)(lVar17 + lVar15 * 4);
      uVar22 = *(uint *)(lVar9 + lVar20 * 4);
      dVar24 = 0.0;
      if (-1 < (int)uVar22) {
        lVar20 = lVar20 << 2;
        do {
          dVar24 = dVar24 + *(double *)(lVar11 + (ulong)uVar22 * 8) *
                            *(double *)(lVar10 + lVar20 * 2);
          uVar22 = *(uint *)(lVar9 + 4 + lVar20);
          lVar20 = lVar20 + 4;
        } while (-1 < (int)uVar22);
      }
      dVar26 = *(double *)(&DAT_003c50a0 + (ulong)(dVar24 <= 0.0) * 8);
      *(double *)((long)__s + lVar15 * 8) = dVar26;
      *(double *)(lVar11 + lVar15 * 8) = (dVar26 - dVar24) / *(double *)(lVar6 + lVar15 * 8);
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar14);
  }
  uVar16 = (ulong)(iVar1 - 1);
  if (0 < iVar1) {
    do {
      lVar17 = (long)*(int *)(lVar18 + uVar16 * 4);
      uVar22 = *(uint *)(lVar7 + lVar17 * 4);
      if ((int)uVar22 < 0) {
        dVar24 = 0.0;
      }
      else {
        lVar17 = lVar17 << 2;
        dVar24 = 0.0;
        do {
          dVar24 = dVar24 + *(double *)(lVar11 + (ulong)uVar22 * 8) *
                            *(double *)(lVar8 + lVar17 * 2);
          uVar22 = *(uint *)(lVar7 + 4 + lVar17);
          lVar17 = lVar17 + 4;
        } while (-1 < (int)uVar22);
      }
      lVar17 = (long)*(int *)(lVar13 + uVar16 * 4);
      *(double *)(lVar11 + lVar17 * 8) = *(double *)(lVar11 + lVar17 * 8) - dVar24;
      bVar12 = 0 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar12);
  }
  if (0 < (int)uVar2) {
    lVar13 = 0;
    do {
      iVar3 = *(int *)(lVar19 + lVar13 * 4);
      lVar18 = (long)Bbegin[iVar3];
      dVar24 = 0.0;
      if (Bbegin[iVar3] < Bend[iVar3]) {
        do {
          dVar24 = dVar24 + *(double *)(lVar11 + (long)Bi[lVar18] * 8) * Bx[lVar18];
          lVar18 = lVar18 + 1;
        } while (Bend[iVar3] != lVar18);
      }
      lVar18 = (long)*(int *)(lVar5 + lVar13 * 4);
      *(double *)((long)__s + lVar18 * 8) = *(double *)((long)__s + lVar18 * 8) - dVar24;
      lVar13 = lVar13 + 1;
    } while (lVar13 != (int)uVar2);
  }
  if ((int)uVar2 < iVar1) {
    lVar13 = (long)(int)uVar2;
    do {
      lVar19 = (long)*(int *)(lVar5 + lVar13 * 4);
      *(double *)((long)__s + lVar19 * 8) =
           *(double *)((long)__s + lVar19 * 8) - *(double *)(lVar11 + lVar19 * 8);
      lVar13 = lVar13 + 1;
    } while (lVar14 != lVar13);
  }
  dVar24 = 0.0;
  dVar26 = 0.0;
  if (0 < iVar1) {
    lVar13 = 0;
    do {
      dVar26 = dVar26 + ABS(*(double *)(lVar11 + lVar13 * 8));
      lVar13 = lVar13 + 1;
    } while (lVar14 != lVar13);
  }
  if (0 < iVar1) {
    dVar24 = 0.0;
    lVar13 = 0;
    do {
      dVar24 = dVar24 + ABS(*(double *)((long)__s + lVar13 * 8));
      lVar13 = lVar13 + 1;
    } while (lVar14 != lVar13);
  }
  lu_matrix_norm(this,Bbegin,Bend,Bi,Bx);
  dVar23 = dVar23 / (dVar25 * *(double *)((long)this + 0x120) + (double)iVar1);
  dVar24 = dVar24 / (dVar26 * *(double *)((long)this + 0x128) + (double)iVar1);
  dVar25 = dVar24;
  if (dVar24 <= dVar23) {
    dVar25 = dVar23;
  }
  *(ulong *)((long)this + 0x130) =
       ~-(ulong)NAN(dVar23) & (ulong)dVar25 | -(ulong)NAN(dVar23) & (ulong)dVar24;
  if (iVar1 < 1) {
    return;
  }
  memset(__s,0,lVar14 << 3);
  return;
}

Assistant:

void lu_residual_test(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m                  = this->m;
    const lu_int rank               = this->rank;
    const lu_int *p                 = this->p;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin_p          = this->Lbegin_p;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    double *rhs                     = this->work0;
    double *lhs                     = this->work1;

    lu_int i, k, ipivot, jpivot, pos;
    double norm_ftran, norm_ftran_res, norm_btran, norm_btran_res, d;

    assert(this->nupdate == 0);

    /* --------------------------------- */
    /* Residual Test with Forward System */
    /* --------------------------------- */

    /* Compute lhs = L\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        d = 0.0;
        for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        ipivot = p[k];
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = rhs[ipivot] - d;
    }

    /* Overwrite lhs by U\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        ipivot = pivotrow[k];
        d = lhs[ipivot] /= row_pivot[ipivot];
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            lhs[i] -= d * Uvalue[pos];
        }
    }

    /* Overwrite rhs by the residual rhs-B*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = lhs[ipivot];
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            rhs[Bi[pos]] -= d * Bx[pos];
        }
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_ftran = lu_onenorm(m, lhs);
    norm_ftran_res = lu_onenorm(m, rhs);

    /* ---------------------------------- */
    /* Residual Test with Backward System */
    /* ---------------------------------- */

    /* Compute lhs = U'\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        ipivot = pivotrow[k];
        d = 0.0;
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Uvalue[pos];
        }
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = (rhs[ipivot] - d) / row_pivot[ipivot];
    }

    /* Overwrite lhs by L'\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        d = 0.0;
        for (pos = Lbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        lhs[p[k]] -= d;
    }

    /* Overwrite rhs by the residual rhs-B'*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = 0.0;
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            d += lhs[Bi[pos]] * Bx[pos];
        }
        rhs[ipivot] -= d;
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_btran = lu_onenorm(m, lhs);
    norm_btran_res = lu_onenorm(m, rhs);

    /* -------- */
    /* Finalize */
    /* -------- */

    lu_matrix_norm(this, Bbegin, Bend, Bi, Bx);
    assert(this->onenorm > 0.0);
    assert(this->infnorm > 0.0);
    this->residual_test = fmax(norm_ftran_res / (m + this->onenorm*norm_ftran),
                               norm_btran_res / (m + this->infnorm*norm_btran));

    /* reset workspace */
    for (i = 0; i < m; i++) rhs[i] = 0;
}